

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

hugeint_t __thiscall
duckdb::Interpolator<false>::
Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::QuantileDirect<duckdb::hugeint_t>>
          (Interpolator<false> *this,hugeint_t *v_t,Vector *result,
          QuantileDirect<duckdb::hugeint_t> *accessor)

{
  bool bVar1;
  QuantileCompare<duckdb::QuantileDirect<duckdb::hugeint_t>_> __comp;
  QuantileCompare<duckdb::QuantileDirect<duckdb::hugeint_t>_> __comp_00;
  QuantileCompare<duckdb::QuantileDirect<duckdb::hugeint_t>_> __comp_01;
  Vector *result_00;
  Vector *result_01;
  hugeint_t hVar2;
  hugeint_t hi;
  hugeint_t lo;
  undefined7 uStack_7f;
  undefined7 uStack_67;
  undefined7 uStack_4f;
  hugeint_t local_48;
  hugeint_t local_38;
  
  bVar1 = this->desc;
  if (this->CRN == this->FRN) {
    __comp._17_7_ = uStack_4f;
    __comp.desc = bVar1;
    __comp.accessor_r = accessor;
    __comp.accessor_l = accessor;
    std::
    nth_element<duckdb::hugeint_t*,duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::hugeint_t>>>
              (v_t + this->begin,v_t + this->CRN,v_t + this->end,__comp);
    hVar2 = CastInterpolation::Cast<duckdb::hugeint_t,duckdb::hugeint_t>
                      ((CastInterpolation *)(v_t + this->FRN),(hugeint_t *)result,result_00);
    return hVar2;
  }
  __comp_00._17_7_ = uStack_67;
  __comp_00.desc = bVar1;
  __comp_00.accessor_r = accessor;
  __comp_00.accessor_l = accessor;
  std::
  nth_element<duckdb::hugeint_t*,duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::hugeint_t>>>
            (v_t + this->begin,v_t + this->FRN,v_t + this->end,__comp_00);
  __comp_01._17_7_ = uStack_7f;
  __comp_01.desc = bVar1;
  __comp_01.accessor_r = accessor;
  __comp_01.accessor_l = accessor;
  std::
  nth_element<duckdb::hugeint_t*,duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::hugeint_t>>>
            (v_t + this->FRN,v_t + this->CRN,v_t + this->end,__comp_01);
  local_38 = CastInterpolation::Cast<duckdb::hugeint_t,duckdb::hugeint_t>
                       ((CastInterpolation *)(v_t + this->FRN),(hugeint_t *)result,result_01);
  local_48 = CastInterpolation::Cast<duckdb::hugeint_t,duckdb::hugeint_t>
                       ((CastInterpolation *)(v_t + this->CRN),(hugeint_t *)result,
                        (Vector *)local_38.upper);
  hVar2 = CastInterpolation::Interpolate<duckdb::hugeint_t>
                    ((CastInterpolation *)&local_38,&local_48,
                     this->RN -
                     (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                      1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0)),
                     (hugeint_t *)local_48.upper);
  return hVar2;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}